

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O1

void __thiscall
Js::DelayedFreeArrayBuffer::CheckAndMarkObject(DelayedFreeArrayBuffer *this,void *candidate)

{
  Type pAVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppAVar6;
  undefined1 local_40 [8];
  Iterator iter;
  
  local_40 = (undefined1  [8])this;
  iter.list = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
               *)this;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (iter.list ==
        (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
        0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    iter.list = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                 *)((iter.list)->super_SListNodeBase<Memory::HeapAllocator>).next;
    if ((undefined1  [8])iter.list == local_40) break;
    ppAVar6 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
              ::Iterator::Data((Iterator *)local_40);
    pAVar1 = *ppAVar6;
    iVar4 = (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[6])(pAVar1);
    if (((char)iVar4 == '\0') &&
       (iVar4 = (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[3])(pAVar1,candidate),
       (char)iVar4 != '\0')) {
      (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[5])(pAVar1,1);
    }
  }
  return;
}

Assistant:

void DelayedFreeArrayBuffer::CheckAndMarkObject(void * candidate)
    {
        this->listOfBuffers.Map([&](Js::ArrayBufferContentForDelayedFreeBase* item) {
            if (!item->IsMarked() && item->IsAddressPartOfBuffer(candidate))
            {
                item->SetMarkBit(true);
            }
        });
    }